

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

uint GetVersFromFPI(ctmbstr fpi)

{
  int iVar1;
  uint local_1c;
  uint i;
  ctmbstr fpi_local;
  
  local_1c = 0;
  while( true ) {
    if (W3C_Doctypes[local_1c].name == (ctmbstr)0x0) {
      return 0;
    }
    if ((W3C_Doctypes[local_1c].fpi != (ctmbstr)0x0) &&
       (iVar1 = prvTidytmbstrcasecmp(W3C_Doctypes[local_1c].fpi,fpi), iVar1 == 0)) break;
    local_1c = local_1c + 1;
  }
  return W3C_Doctypes[local_1c].vers;
}

Assistant:

static uint GetVersFromFPI(ctmbstr fpi)
{
    uint i;

    for (i = 0; W3C_Doctypes[i].name; ++i)
        if (W3C_Doctypes[i].fpi != NULL && TY_(tmbstrcasecmp)(W3C_Doctypes[i].fpi, fpi) == 0)
            return W3C_Doctypes[i].vers;

    return 0;
}